

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall QCborValue::QCborValue(QCborValue *this,QLatin1StringView s)

{
  QCborContainerPrivate *this_00;
  
  this->n = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  this_00->usedData = 0;
  (this_00->data).d.d = (Data *)0x0;
  (this_00->data).d.ptr = (char *)0x0;
  (this_00->data).d.size = 0;
  (this_00->elements).d.d = (Data *)0x0;
  (this_00->elements).d.ptr = (Element *)0x0;
  (this_00->elements).d.size = 0;
  this->container = this_00;
  this->t = String;
  QCborContainerPrivate::append(this_00,s);
  (this->container->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i = 1;
  return;
}

Assistant:

QCborValue::QCborValue(QLatin1StringView s)
    : n(0), container(new QCborContainerPrivate), t(String)
{
    container->append(s);
    container->ref.storeRelaxed(1);
}